

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O0

If_LibLut_t * If_LibLutSetSimple(int nLutSize)

{
  If_LibLut_t *local_8ce0;
  If_LibLut_t *pLutLib;
  If_LibLut_t s_LutLib3;
  If_LibLut_t s_LutLib4;
  If_LibLut_t s_LutLib5;
  If_LibLut_t s_LutLib6;
  If_LibLut_t s_LutLib7;
  If_LibLut_t s_LutLib8;
  If_LibLut_t s_LutLib9;
  If_LibLut_t s_LutLib10;
  If_LibLut_t *pIStack_10;
  int nLutSize_local;
  
  memcpy(s_LutLib9.pLutDelays[0x20] + 0x1f,&PTR_anon_var_dwarf_1c2d56_00f90d28,0x1198);
  memcpy(s_LutLib8.pLutDelays[0x20] + 0x1f,&PTR_anon_var_dwarf_1c2d56_00f91ec0,0x1198);
  memcpy(s_LutLib7.pLutDelays[0x20] + 0x1f,&PTR_anon_var_dwarf_1c2d56_00f93058,0x1198);
  memcpy(s_LutLib6.pLutDelays[0x20] + 0x1f,&PTR_anon_var_dwarf_1c2d56_00f941f0,0x1198);
  memcpy(s_LutLib5.pLutDelays[0x20] + 0x1f,&PTR_anon_var_dwarf_1c2d56_00f95388,0x1198);
  memcpy(s_LutLib4.pLutDelays[0x20] + 0x1f,&PTR_anon_var_dwarf_1c2d56_00f96520,0x1198);
  memcpy(s_LutLib3.pLutDelays[0x20] + 0x1f,&PTR_anon_var_dwarf_1c2d56_00f976b8,0x1198);
  memcpy(&pLutLib,&PTR_anon_var_dwarf_1c2d56_00f98850,0x1198);
  if ((2 < nLutSize) && (nLutSize < 0xb)) {
    switch(nLutSize) {
    case 3:
      local_8ce0 = (If_LibLut_t *)&pLutLib;
      break;
    case 4:
      local_8ce0 = (If_LibLut_t *)(s_LutLib3.pLutDelays[0x20] + 0x1f);
      break;
    case 5:
      local_8ce0 = (If_LibLut_t *)(s_LutLib4.pLutDelays[0x20] + 0x1f);
      break;
    case 6:
      local_8ce0 = (If_LibLut_t *)(s_LutLib5.pLutDelays[0x20] + 0x1f);
      break;
    case 7:
      local_8ce0 = (If_LibLut_t *)(s_LutLib6.pLutDelays[0x20] + 0x1f);
      break;
    case 8:
      local_8ce0 = (If_LibLut_t *)(s_LutLib7.pLutDelays[0x20] + 0x1f);
      break;
    case 9:
      local_8ce0 = (If_LibLut_t *)(s_LutLib8.pLutDelays[0x20] + 0x1f);
      break;
    case 10:
      local_8ce0 = (If_LibLut_t *)(s_LutLib9.pLutDelays[0x20] + 0x1f);
      break;
    default:
      local_8ce0 = (If_LibLut_t *)0x0;
    }
    if (local_8ce0 == (If_LibLut_t *)0x0) {
      pIStack_10 = (If_LibLut_t *)0x0;
    }
    else {
      pIStack_10 = If_LibLutDup(local_8ce0);
    }
    return pIStack_10;
  }
  __assert_fail("nLutSize >= 3 && nLutSize <= 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifLibLut.c"
                ,0x1c1,"If_LibLut_t *If_LibLutSetSimple(int)");
}

Assistant:

If_LibLut_t * If_LibLutSetSimple( int nLutSize )
{
    If_LibLut_t s_LutLib10= { "lutlib",10, 0, {0,1,1,1,1,1,1,1,1,1,1}, {{0},{1},{1},{1},{1},{1},{1},{1},{1},{1},{1}} };
    If_LibLut_t s_LutLib9 = { "lutlib", 9, 0, {0,1,1,1,1,1,1,1,1,1}, {{0},{1},{1},{1},{1},{1},{1},{1},{1},{1}} };
    If_LibLut_t s_LutLib8 = { "lutlib", 8, 0, {0,1,1,1,1,1,1,1,1}, {{0},{1},{1},{1},{1},{1},{1},{1},{1}} };
    If_LibLut_t s_LutLib7 = { "lutlib", 7, 0, {0,1,1,1,1,1,1,1}, {{0},{1},{1},{1},{1},{1},{1},{1}} };
    If_LibLut_t s_LutLib6 = { "lutlib", 6, 0, {0,1,1,1,1,1,1}, {{0},{1},{1},{1},{1},{1},{1}} };
    If_LibLut_t s_LutLib5 = { "lutlib", 5, 0, {0,1,1,1,1,1}, {{0},{1},{1},{1},{1},{1}} };
    If_LibLut_t s_LutLib4 = { "lutlib", 4, 0, {0,1,1,1,1}, {{0},{1},{1},{1},{1}} };
    If_LibLut_t s_LutLib3 = { "lutlib", 3, 0, {0,1,1,1}, {{0},{1},{1},{1}} };
    If_LibLut_t * pLutLib;
    assert( nLutSize >= 3 && nLutSize <= 10 );
    switch ( nLutSize )
    {
        case 3:  pLutLib = &s_LutLib3; break;
        case 4:  pLutLib = &s_LutLib4; break;
        case 5:  pLutLib = &s_LutLib5; break;
        case 6:  pLutLib = &s_LutLib6; break;
        case 7:  pLutLib = &s_LutLib7; break;
        case 8:  pLutLib = &s_LutLib8; break;
        case 9:  pLutLib = &s_LutLib9; break;
        case 10: pLutLib = &s_LutLib10; break;
        default: pLutLib = NULL; break;
    }
    if ( pLutLib == NULL )
        return NULL;
    return If_LibLutDup(pLutLib);
}